

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O2

void blowfish_enc(mbedtls_blowfish_context *ctx,uint32_t *xl,uint32_t *xr)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  long lVar5;
  
  uVar2 = *xl;
  uVar4 = *xr;
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    uVar3 = uVar2 ^ ctx->P[lVar5];
    uVar1 = F(ctx,uVar3);
    uVar2 = uVar1 ^ uVar4;
    uVar4 = uVar3;
  }
  uVar3 = ctx->P[0x10];
  *xl = uVar4 ^ ctx->P[0x11];
  *xr = uVar2 ^ uVar3;
  return;
}

Assistant:

static void blowfish_enc( mbedtls_blowfish_context *ctx, uint32_t *xl, uint32_t *xr )
{
    uint32_t  Xl, Xr, temp;
    short i;

    Xl = *xl;
    Xr = *xr;

    for( i = 0; i < MBEDTLS_BLOWFISH_ROUNDS; ++i )
    {
        Xl = Xl ^ ctx->P[i];
        Xr = F( ctx, Xl ) ^ Xr;

        temp = Xl;
        Xl = Xr;
        Xr = temp;
    }

    temp = Xl;
    Xl = Xr;
    Xr = temp;

    Xr = Xr ^ ctx->P[MBEDTLS_BLOWFISH_ROUNDS];
    Xl = Xl ^ ctx->P[MBEDTLS_BLOWFISH_ROUNDS + 1];

    *xl = Xl;
    *xr = Xr;
}